

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O2

void __thiscall DataSourceBase::DataSourceBase(DataSourceBase *this,string *_path)

{
  (this->super_Source)._vptr_Source = (_func_int **)&PTR___cxa_pure_virtual_00152880;
  std::__cxx11::string::string((string *)&this->path,(string *)_path);
  this->loaded = false;
  (this->animation_table).
  super__Vector_base<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->animation_table).
  super__Vector_base<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->animation_table).
  super__Vector_base<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

DataSourceBase::DataSourceBase(const std::string &_path)
  : path(_path)
  , loaded(false) {
}